

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt_PackSetOversampling(stbtt_pack_context *spc,uint h_oversample,uint v_oversample)

{
  if (8 < h_oversample) {
    __assert_fail("h_oversample <= 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                  ,0xee2,
                  "void stbtt_PackSetOversampling(stbtt_pack_context *, unsigned int, unsigned int)"
                 );
  }
  if (v_oversample < 9) {
    spc->h_oversample = h_oversample;
    spc->v_oversample = v_oversample;
    return;
  }
  __assert_fail("v_oversample <= 8",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                ,0xee3,
                "void stbtt_PackSetOversampling(stbtt_pack_context *, unsigned int, unsigned int)");
}

Assistant:

STBTT_DEF void stbtt_PackSetOversampling(stbtt_pack_context *spc, unsigned int h_oversample, unsigned int v_oversample)
{
   STBTT_assert(h_oversample <= STBTT_MAX_OVERSAMPLE);
   STBTT_assert(v_oversample <= STBTT_MAX_OVERSAMPLE);
   if (h_oversample <= STBTT_MAX_OVERSAMPLE)
      spc->h_oversample = h_oversample;
   if (v_oversample <= STBTT_MAX_OVERSAMPLE)
      spc->v_oversample = v_oversample;
}